

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O3

bool EV_DoElevator(line_t_conflict *line,EElevator elevtype,double speed,double height,int tag)

{
  double dVar1;
  double dVar2;
  DSectorEffect *pDVar3;
  sector_t_conflict *psVar4;
  bool bVar5;
  uint uVar6;
  DElevator *this;
  bool bVar7;
  sector_t_conflict *this_00;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  vertex_t *spot;
  FSectorTagIterator itr;
  vertex_t *local_68;
  FSectorTagIterator local_60;
  double local_58;
  double dStack_50;
  ulong local_40;
  double local_38;
  
  if (line != (line_t_conflict *)0x0 || elevtype != elevateCurrent) {
    if (tag == 0) {
      local_60.searchtag = -0x80000000;
      local_60.start = -1;
      if ((line != (line_t_conflict *)0x0) && (line->backsector != (sector_t_conflict *)0x0)) {
        local_60.start = (int)((ulong)((long)line->backsector - (long)sectors) >> 3) * 0x7a44c6b;
      }
    }
    else {
      local_60.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
      local_60.searchtag = tag;
    }
    local_58 = height;
    local_38 = speed;
    uVar6 = FSectorTagIterator::Next(&local_60);
    if (-1 < (int)uVar6) {
      dStack_50 = local_58;
      bVar7 = false;
      local_40 = (ulong)elevtype;
      do {
        this_00 = sectors + uVar6;
        bVar5 = sector_t::PlaneMoving(this_00,0);
        if (bVar5) {
LAB_003f8e79:
          uVar6 = FSectorTagIterator::Next(&local_60);
          goto LAB_003f8e81;
        }
        pDVar3 = (this_00->ceilingdata).field_0.p;
        if (pDVar3 != (DSectorEffect *)0x0) {
          if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003f8e79;
          (this_00->ceilingdata).field_0.p = (DSectorEffect *)0x0;
        }
        this = (DElevator *)
               M_Malloc_Dbg(0x78,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                            ,0x1f9);
        DElevator::DElevator(this,this_00);
        this->m_Type = elevtype;
        this->m_Speed = local_38;
        StartFloorSound((this->super_DMover).super_DSectorEffect.m_Sector);
        if (elevateLower < elevtype) goto LAB_003f91a4;
        dVar8 = (this_00->floorplane).D;
        dVar10 = (this_00->floorplane).normal.Y;
        dVar1 = (this_00->floorplane).negiC;
        dVar2 = (this_00->ceilingplane).D;
        dVar9 = (this_00->ceilingplane).normal.X;
        dVar12 = (this_00->ceilingplane).normal.Y;
        dVar11 = (this_00->floorplane).normal.X;
        dVar15 = (this_00->centerspot).X;
        dVar14 = dVar15 * dVar11;
        dVar15 = dVar9 * dVar15;
        dVar17 = (this_00->centerspot).Y;
        dVar16 = dVar17 * dVar10;
        dVar17 = dVar12 * dVar17;
        dVar13 = (this_00->ceilingplane).negiC;
        dVar18 = dVar1 * (dVar8 + dVar14 + dVar16);
        dVar19 = dVar13 * (dVar2 + dVar15 + dVar17);
        switch((long)&switchD_003f8f8d::switchdataD_005fe888 +
               (long)(int)(&switchD_003f8f8d::switchdataD_005fe888)[local_40]) {
        case 0x3f8f8f:
          this->m_Direction = 1;
          dVar8 = sector_t::FindNextHighestFloor((sector_t *)this_00,&local_68);
          break;
        case 0x3f8fa6:
          this->m_Direction = -1;
          dVar18 = dVar18 - local_58;
          dVar19 = dVar19 - dStack_50;
LAB_003f90a8:
          dVar8 = (this_00->ceilingplane).normal.Z;
          this->m_FloorDestDist = -((this_00->floorplane).normal.Z * dVar18 + dVar14 + dVar16);
          this->m_CeilingDestDist = -(dVar8 * dVar19 + dVar15 + dVar17);
          goto LAB_003f91a4;
        case 0x3f8fb9:
          psVar4 = line->frontsector;
          dVar15 = (line->v1->p).X;
          dVar17 = (line->v1->p).Y;
          dVar9 = dVar9 * dVar15;
          dVar10 = dVar10 * dVar17;
          dVar11 = dVar11 * dVar15;
          dVar12 = dVar12 * dVar17;
          dVar17 = (psVar4->floorplane).negiC *
                   (dVar17 * (psVar4->floorplane).normal.Y +
                   (psVar4->floorplane).normal.X * dVar15 + (psVar4->floorplane).D);
          dVar15 = (this_00->ceilingplane).normal.Z;
          dVar14 = -(dVar17 * (this_00->floorplane).normal.Z + dVar10 + dVar11);
          this->m_FloorDestDist = dVar14;
          this->m_CeilingDestDist =
               -(((dVar13 * (dVar12 + dVar2 + dVar9) - dVar1 * (dVar10 + dVar11 + dVar8)) + dVar17)
                 * dVar15 + dVar9 + dVar12);
          this->m_Direction = (uint)(dVar14 <= dVar8) * 2 + -1;
          goto LAB_003f91a4;
        case 0x3f909a:
          this->m_Direction = 1;
          dVar18 = dVar18 + local_58;
          dVar19 = dVar19 + dStack_50;
          goto LAB_003f90a8;
        case 0x3f90da:
          this->m_Direction = -1;
          dVar8 = sector_t::FindNextLowestFloor((sector_t *)this_00,&local_68);
        }
        dVar11 = (local_68->p).X;
        dVar15 = (local_68->p).Y;
        dVar10 = (this_00->ceilingplane).D;
        dVar17 = (this_00->ceilingplane).normal.X * dVar11;
        dVar13 = (this_00->floorplane).normal.Y * dVar15;
        dVar11 = (this_00->floorplane).normal.X * dVar11;
        dVar15 = (this_00->ceilingplane).normal.Y * dVar15;
        dVar1 = (this_00->floorplane).D;
        dVar2 = (this_00->ceilingplane).negiC;
        dVar9 = (this_00->floorplane).negiC;
        dVar12 = (this_00->ceilingplane).normal.Z;
        this->m_FloorDestDist = -((this_00->floorplane).normal.Z * dVar8 + dVar11 + dVar13);
        this->m_CeilingDestDist =
             -(dVar12 * ((dVar2 * (dVar17 + dVar10 + dVar15) - dVar9 * (dVar11 + dVar1 + dVar13)) +
                        dVar8) + dVar15 + dVar17);
LAB_003f91a4:
        uVar6 = FSectorTagIterator::Next(&local_60);
        bVar7 = true;
LAB_003f8e81:
        if ((int)uVar6 < 0) {
          return bVar7;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool EV_DoElevator (line_t *line, DElevator::EElevator elevtype,
					double speed, double height, int tag)
{
	int			secnum;
	bool		rtn;
	sector_t*	sec;
	DElevator*	elevator;
	double		floorheight, ceilingheight;
	double		newheight;
	vertex_t*	spot;

	if (!line && (elevtype == DElevator::elevateCurrent))
		return false;

	secnum = -1;
	rtn = false;

	FSectorTagIterator itr(tag, line);

	// act on all sectors with the same tag as the triggering linedef
	while ((secnum = itr.Next()) >= 0)
	{
		sec = &sectors[secnum];
		// If either floor or ceiling is already activated, skip it
		if (sec->PlaneMoving(sector_t::floor) || sec->ceilingdata) //jff 2/22/98
			continue; // the loop used to break at the end if tag were 0, but would miss that step if "continue" occured [FDARI]

		// create and initialize new elevator thinker
		rtn = true;
		elevator = new DElevator (sec);
		elevator->m_Type = elevtype;
		elevator->m_Speed = speed;
		elevator->StartFloorSound ();

		floorheight = sec->CenterFloor ();
		ceilingheight = sec->CenterCeiling ();

		// set up the fields according to the type of elevator action
		switch (elevtype)
		{
		// elevator down to next floor
		case DElevator::elevateDown:
			elevator->m_Direction = -1;
			newheight = sec->FindNextLowestFloor (&spot);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (spot, newheight);
			newheight += sec->ceilingplane.ZatPoint(spot) - sec->floorplane.ZatPoint(spot);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (spot, newheight);
			break;

		// elevator up to next floor
		case DElevator::elevateUp:
			elevator->m_Direction = 1;
			newheight = sec->FindNextHighestFloor (&spot);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (spot, newheight);
			newheight += sec->ceilingplane.ZatPoint(spot) - sec->floorplane.ZatPoint(spot);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (spot, newheight);
			break;

		// elevator to floor height of activating switch's front sector
		case DElevator::elevateCurrent:
			newheight = line->frontsector->floorplane.ZatPoint (line->v1);
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (line->v1, newheight);
			newheight += sec->ceilingplane.ZatPoint(line->v1) - sec->floorplane.ZatPoint(line->v1);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (line->v1, newheight);

			elevator->m_Direction =
				elevator->m_FloorDestDist > sec->floorplane.fD() ? -1 : 1;
			break;

		// [RH] elevate up by a specific amount
		case DElevator::elevateRaise:
			elevator->m_Direction = 1;
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (sec->centerspot, floorheight + height);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (sec->centerspot, ceilingheight + height);
			break;

		// [RH] elevate down by a specific amount
		case DElevator::elevateLower:
			elevator->m_Direction = -1;
			elevator->m_FloorDestDist = sec->floorplane.PointToDist (sec->centerspot, floorheight - height);
			elevator->m_CeilingDestDist = sec->ceilingplane.PointToDist (sec->centerspot, ceilingheight - height);
			break;
		}
	}
	return rtn;
}